

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O0

void __thiscall sjtu::UserManager::login(UserManager *this,int argc,string *argv)

{
  bool bVar1;
  long lVar2;
  void *pvVar3;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  pair<long,_bool> pVar4;
  userType *user;
  pair<long,_bool> tmp;
  int i;
  string uspass;
  string usname;
  char *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  StringHasher *in_stack_ffffffffffffff20;
  string local_a8 [16];
  unsigned_long_long *in_stack_ffffffffffffff68;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>
  *in_stack_ffffffffffffff70;
  long local_80;
  byte local_78;
  int local_5c;
  string local_58 [32];
  string local_38 [32];
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  for (local_5c = 0; local_5c < local_c; local_5c = local_5c + 2) {
    bVar1 = std::operator==(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if (bVar1) {
      std::__cxx11::string::operator=(local_38,(string *)((long)local_5c * 0x20 + 0x20 + local_18));
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      if (bVar1) {
        std::__cxx11::string::operator=
                  (local_58,(string *)((long)local_5c * 0x20 + 0x20 + local_18));
      }
    }
  }
  std::__cxx11::string::string(local_a8,local_38);
  StringHasher::operator()
            (in_stack_ffffffffffffff20,
             (string *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  pVar4 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_80 = pVar4.first;
  local_78 = pVar4.second;
  std::__cxx11::string::~string(local_a8);
  if ((local_78 & 1) == 1) {
    lVar2 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))(*(long **)(in_RDI + 0x10),&local_80);
    bVar1 = std::operator==(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if ((bVar1) && (*(int *)(lVar2 + 0x6c) != *(int *)(in_RDI + 0x18))) {
      *(undefined4 *)(lVar2 + 0x6c) = *(undefined4 *)(in_RDI + 0x18);
      (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))();
      pvVar3 = (void *)std::ostream::operator<<(&std::cout,0);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      pvVar3 = (void *)std::ostream::operator<<(&std::cout,-1);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    pvVar3 = (void *)std::ostream::operator<<(&std::cout,-1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void login(int argc, std::string *argv) {
            std::string usname, uspass;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") usname = argv[i + 1];
                else if (argv[i] == "-p") uspass = argv[i + 1];
            }
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(usname));
            if (tmp.second == true) {
                userType *user = UserFile->read(tmp.first);
                if (uspass == user->password && user->is_online != online_flag) {
                    user->is_online = online_flag;
                    UserFile->save(user->offset);
                    std::cout << 0 << std::endl;
                } else std::cout << -1 << std::endl;
            } else std::cout << -1 << std::endl;
        }